

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int x509v3_looks_like_dns_name(uchar *in,size_t len)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  
  if (len == 0) {
    return 0;
  }
  uVar3 = len - (in[len - 1] == '.');
  if (1 < uVar3) {
    if ((*in != '*') || (in[1] != '.')) goto LAB_0019cccb;
    in = in + 2;
    uVar3 = uVar3 - 2;
  }
  if (uVar3 == 0) {
    return 0;
  }
LAB_0019cccb:
  uVar5 = 0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = in[uVar4];
    iVar2 = OPENSSL_isalnum((uint)bVar1);
    if ((iVar2 == 0) && (bVar1 != 0x5f)) {
      if (bVar1 == 0x2e) {
        if ((uVar4 <= uVar5) || (uVar3 - 1 <= uVar4)) break;
        uVar5 = uVar4 + 1;
      }
      else if ((bVar1 != 0x3a) && ((bVar1 != 0x2d || (uVar4 <= uVar5)))) break;
    }
  }
  return (uint)(uVar3 <= uVar4);
}

Assistant:

int x509v3_looks_like_dns_name(const unsigned char *in, size_t len) {
  // This function is used as a heuristic for whether a common name is a
  // hostname to be matched, or merely a decorative name to describe the
  // subject. This heuristic must be applied to both name constraints and the
  // common name fallback, so it must be loose enough to accept hostname
  // common names, and tight enough to reject decorative common names.

  if (len > 0 && in[len - 1] == '.') {
    len--;
  }

  // Wildcards are allowed in front.
  if (len >= 2 && in[0] == '*' && in[1] == '.') {
    in += 2;
    len -= 2;
  }

  if (len == 0) {
    return 0;
  }

  size_t label_start = 0;
  for (size_t i = 0; i < len; i++) {
    unsigned char c = in[i];
    if (OPENSSL_isalnum(c) || (c == '-' && i > label_start) ||
        // These are not valid characters in hostnames, but commonly found
        // in deployments outside the Web PKI.
        c == '_' || c == ':') {
      continue;
    }

    // Labels must not be empty.
    if (c == '.' && i > label_start && i < len - 1) {
      label_start = i + 1;
      continue;
    }

    return 0;
  }

  return 1;
}